

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.h
# Opt level: O3

Bipartition * __thiscall
Bipartition::operator~(Bipartition *__return_storage_ptr__,Bipartition *this)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  getPartition(&local_30,this);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            (&local_50,&local_30);
  Bipartition(__return_storage_ptr__,&local_50);
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_50);
  if (bVar1) {
    if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_30);
    if (bVar1) {
      if (local_30.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

inline Bipartition operator~() const {
        return Bipartition(~(this->getPartition()));
    }